

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathDifference(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  int iVar1;
  xmlNodePtr local_48;
  int local_3c;
  xmlNodePtr cur;
  int l1;
  int i;
  xmlNodeSetPtr ret;
  xmlNodeSetPtr nodes2_local;
  xmlNodeSetPtr nodes1_local;
  
  nodes1_local = nodes1;
  if (((((nodes2 != (xmlNodeSetPtr)0x0) && (nodes2->nodeNr != 0)) &&
       (nodes2->nodeTab != (xmlNodePtr *)0x0)) &&
      ((nodes1_local = xmlXPathNodeSetCreate((xmlNodePtr)0x0), nodes1 != (xmlNodeSetPtr)0x0 &&
       (nodes1->nodeNr != 0)))) && (nodes1->nodeTab != (xmlNodePtr *)0x0)) {
    if (nodes1 == (xmlNodeSetPtr)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = nodes1->nodeNr;
    }
    for (cur._4_4_ = 0; cur._4_4_ < local_3c; cur._4_4_ = cur._4_4_ + 1) {
      if (((nodes1 == (xmlNodeSetPtr)0x0) || (cur._4_4_ < 0)) || (nodes1->nodeNr <= cur._4_4_)) {
        local_48 = (xmlNodePtr)0x0;
      }
      else {
        local_48 = nodes1->nodeTab[cur._4_4_];
      }
      iVar1 = xmlXPathNodeSetContains(nodes2,local_48);
      if ((iVar1 == 0) && (iVar1 = xmlXPathNodeSetAddUnique(nodes1_local,local_48), iVar1 < 0)) {
        return nodes1_local;
      }
    }
  }
  return nodes1_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathDifference (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    xmlNodeSetPtr ret;
    int i, l1;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(nodes1);

    /* TODO: Check memory error. */
    ret = xmlXPathNodeSetCreate(NULL);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(ret);

    l1 = xmlXPathNodeSetGetLength(nodes1);

    for (i = 0; i < l1; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (!xmlXPathNodeSetContains(nodes2, cur)) {
            /* TODO: Propagate memory error. */
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        break;
	}
    }
    return(ret);
}